

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple8b_rle.h
# Opt level: O1

uint32_t FastPForLib::Simple8b_Codec::Decompress
                   (uint64_t *input,uint32_t param_2,uint32_t *output,uint32_t outOffset,
                   uint32_t outCount)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar4 = outCount + outOffset;
  uVar1 = 0;
  do {
    uVar2 = uVar4 - outOffset;
    if (uVar4 < outOffset || uVar2 == 0) {
      return uVar1;
    }
    uVar6 = input[uVar1];
    uVar10 = uVar6 >> 0x3c;
    if (uVar10 != 0) {
      uVar3 = (uint)(uVar6 >> 0x20);
      uVar9 = uVar3 >> 0x1c;
      if (uVar9 == 0xf) {
        uVar3 = uVar3 & 0xfffffff;
        if (uVar2 <= uVar3) {
          uVar3 = uVar2;
        }
        for (; uVar3 != 0; uVar3 = uVar3 - 1) {
          uVar7 = (ulong)outOffset;
          outOffset = outOffset + 1;
          output[uVar7] = (uint32_t)uVar6;
        }
      }
      else {
        uVar7 = (ulong)*(uint *)(Simple8b_Codec_bitLength + uVar10 * 4);
        uVar3 = ~(uint)(-1L << (uVar7 & 0x3f));
        if (*(uint *)(Simple8b_Codec_bitLength + (ulong)(uVar9 ^ 0xf) * 4) < uVar2) {
          uVar2 = *(uint *)(Simple8b_Codec_bitLength + (ulong)(uVar9 ^ 0xf) * 4);
        }
        if (uVar2 == 0) {
          uVar8 = 0;
        }
        else {
          uVar8 = 0;
          do {
            uVar5 = uVar6 >> (uVar7 & 0x3f);
            output[outOffset + uVar8] = (uint)uVar6 & uVar3;
            uVar11 = uVar5 >> (uVar7 & 0x3f);
            output[(ulong)outOffset + uVar8 + 1] = (uint)uVar5 & uVar3;
            uVar6 = uVar11 >> (uVar7 & 0x3f);
            output[(ulong)outOffset + uVar8 + 2] = (uint)uVar11 & uVar3;
            uVar5 = uVar6 >> (uVar7 & 0x3f);
            output[(ulong)outOffset + uVar8 + 3] = (uint)uVar6 & uVar3;
            uVar6 = uVar5 >> (uVar7 & 0x3f);
            output[(ulong)outOffset + uVar8 + 4] = (uint)uVar5 & uVar3;
            uVar11 = uVar6 >> (uVar7 & 0x3f);
            output[(ulong)outOffset + uVar8 + 5] = (uint)uVar6 & uVar3;
            uVar5 = uVar11 >> (uVar7 & 0x3f);
            output[(ulong)outOffset + uVar8 + 6] = (uint)uVar11 & uVar3;
            uVar6 = uVar5 >> (uVar7 & 0x3f);
            output[(ulong)outOffset + uVar8 + 7] = (uint)uVar5 & uVar3;
            uVar8 = uVar8 + 8;
          } while (uVar8 < uVar2);
        }
        if ((uint)uVar8 < uVar2) {
          uVar8 = uVar8 & 0xffffffff;
          do {
            output[outOffset + uVar8] = (uint)uVar6 & uVar3;
            uVar6 = uVar6 >> (uVar7 & 0x3f);
            uVar8 = uVar8 + 1;
          } while (uVar2 != uVar8);
        }
        outOffset = outOffset + uVar2;
      }
    }
    uVar1 = uVar1 + 1;
  } while (uVar10 != 0);
  return uVar1;
}

Assistant:

static uint32_t Decompress(const uint64_t *input, uint32_t,
                             uint32_t *output, uint32_t outOffset,
                             uint32_t outCount) {
    uint32_t inPos = 0;
    uint32_t outPos = outOffset;
    uint32_t outEnd = outOffset + outCount;

    while (outPos < outEnd) {
      uint32_t remainingCount = outEnd - outPos;

      uint64_t val = input[inPos++];
      uint32_t code = static_cast<uint32_t>(val >> SIMPLE8B_BITSIZE);

      // optional check for end-of-stream
      if (code == 0) {
        break; // end of stream
      }

#if defined(_SIMPLE8B_USE_RLE)
      else if (code == SIMPLE8B_MAXCODE) {
        // decode rle-encoded integers
        uint32_t repeatValue = static_cast<uint32_t>(val & RLE_MAX_VALUE_MASK);
        uint32_t repeatCount = static_cast<uint32_t>(
            (val >> RLE_MAX_VALUE_BITS) & RLE_MAX_COUNT_MASK);
        repeatCount =
            (repeatCount < remainingCount) ? repeatCount : remainingCount;

        for (uint32_t i = 0; i < repeatCount; ++i) {
          output[outPos++] = repeatValue;
        }
      }
#endif
      else {
        // decode bit-packed integers
        uint32_t intNum = Simple8b_Codec_bitLength[SIMPLE8B_MAXCODE - code];
        uint32_t bitLen = Simple8b_Codec_bitLength[code];
        uint64_t bitMask = (1ULL << bitLen) - 1;
        intNum = (intNum < remainingCount)
                     ? intNum
                     : remainingCount; // optional buffer end check

#if defined(_DONT_UNROLL_LOOP)
        for (uint32_t i = 0; i < intNum; ++i) {
          output[outPos++] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
        }
#else
        uint32_t i = 0;
        for (; i < intNum; i += 8) {
          auto out = output + outPos + i;
          out[0] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
          out[1] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
          out[2] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
          out[3] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
          out[4] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
          out[5] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
          out[6] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
          out[7] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
        }
        for (; i < intNum; ++i) {
          auto out = output + outPos + i;
          out[0] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
        }
        outPos += intNum;
#endif
      }
    }